

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void check_input<unsigned_int>(uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0)

{
  uchar **ppuVar1;
  uchar *puVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  byte *pbVar6;
  uint uVar7;
  lcp_t lVar8;
  uchar uVar9;
  long lVar10;
  byte *pbVar11;
  byte bVar12;
  size_t sVar13;
  
  if (1 < n0) {
    sVar13 = 1;
    do {
      if (from0[sVar13 - 1] == (uchar *)0x0) goto LAB_0023f62a;
      if (from0[sVar13] == (uchar *)0x0) goto LAB_0023f649;
      iVar3 = strcmp((char *)from0[sVar13 - 1],(char *)from0[sVar13]);
      if (0 < iVar3) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                            __debug_indent_str_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Oops: \'\'",8);
        puVar2 = from0[sVar13 - 1];
        if (puVar2 == (uchar *)0x0) {
          std::ios::clear((int)*(undefined8 *)(*(long *)poVar4 + -0x18) + (int)poVar4);
        }
        else {
          sVar5 = strlen((char *)puVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar2,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\' > \'\'",7);
        puVar2 = from0[sVar13];
        if (puVar2 == (uchar *)0x0) {
          std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
        }
        else {
          sVar5 = strlen((char *)puVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar2,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\'\n",3);
      }
      sVar13 = sVar13 + 1;
    } while (n0 != sVar13);
    if (1 < n0) {
      sVar13 = 1;
      do {
        uVar9 = *from0[sVar13 - 1];
        if (uVar9 == '\0') {
          lVar8 = 0;
        }
        else {
          lVar8 = 0;
          do {
            if (uVar9 != from0[sVar13][lVar8]) break;
            uVar9 = from0[sVar13 - 1][lVar8 + 1];
            lVar8 = lVar8 + 1;
          } while (uVar9 != '\0');
        }
        if (lVar8 != lcp_input0[sVar13 - 1]) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Oops: ",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"lcp(\'",5);
          puVar2 = from0[sVar13 - 1];
          if (puVar2 == (uchar *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar4 + -0x18) + (int)poVar4);
          }
          else {
            sVar5 = strlen((char *)puVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar2,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\', \'",4);
          puVar2 = from0[sVar13];
          if (puVar2 == (uchar *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar5 = strlen((char *)puVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)puVar2,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\')=",3);
          uVar9 = *from0[sVar13 - 1];
          if (uVar9 != '\0') {
            lVar10 = 0;
            do {
              if (uVar9 != from0[sVar13][lVar10]) break;
              uVar9 = from0[sVar13 - 1][lVar10 + 1];
              lVar10 = lVar10 + 1;
            } while (uVar9 != '\0');
          }
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," != ",4);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 != n0);
      if (1 < n0) {
        sVar13 = 1;
        do {
          if (from0[sVar13 - 1] == (uchar *)0x0) {
LAB_0023f62a:
            __assert_fail("a != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
          }
          if (from0[sVar13] == (uchar *)0x0) {
LAB_0023f649:
            __assert_fail("b != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
          }
          iVar3 = strcmp((char *)from0[sVar13 - 1],(char *)from0[sVar13]);
          if (0 < iVar3) {
            __assert_fail("cmp(from0[i-1],from0[i])<=0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x42f,
                          "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                         );
          }
          sVar13 = sVar13 + 1;
        } while (n0 != sVar13);
        pbVar6 = *from0;
        if (1 < n0) {
          sVar13 = 1;
          pbVar11 = pbVar6;
          do {
            ppuVar1 = from0 + sVar13;
            lVar8 = 0;
            bVar12 = *pbVar11;
            while ((bVar12 != 0 && (bVar12 == (*ppuVar1)[lVar8]))) {
              lVar10 = lVar8 + 1;
              lVar8 = lVar8 + 1;
              bVar12 = pbVar11[lVar10];
            }
            if (lVar8 != lcp_input0[sVar13 - 1]) {
              __assert_fail("lcp(from0[i-1],from0[i])==lcp_input0[i-1]",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x430,
                            "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                           );
            }
            sVar13 = sVar13 + 1;
            pbVar11 = *ppuVar1;
          } while (sVar13 != n0);
        }
        goto LAB_0023f572;
      }
    }
  }
  pbVar6 = *from0;
LAB_0023f572:
  if (pbVar6 == (byte *)0x0) {
LAB_0023f668:
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                  ,0x38,"uint32_t get_char(unsigned char *, size_t)");
  }
  if (*pbVar6 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (uint)*pbVar6 << 0x18;
    if (pbVar6[1] != 0) {
      uVar7 = uVar7 | (uint)pbVar6[1] << 0x10;
      if (pbVar6[2] != 0) {
        uVar7 = uVar7 | CONCAT11(pbVar6[2],pbVar6[3]);
      }
    }
  }
  if (uVar7 != *cache_input0) {
    __assert_fail("get_char<CharT>(*from0,0)==cache_input0[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x431,
                  "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                 );
  }
  if (1 < n0) {
    lVar10 = 0;
    do {
      puVar2 = from0[lVar10 + 1];
      if (puVar2 == (uchar *)0x0) goto LAB_0023f668;
      lVar8 = lcp_input0[lVar10];
      if (puVar2[lVar8] == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (uint)puVar2[lVar8] << 0x18;
        if (puVar2[lVar8 + 1] != 0) {
          uVar7 = uVar7 | (uint)puVar2[lVar8 + 1] << 0x10;
          if (puVar2[lVar8 + 2] != '\0') {
            uVar7 = uVar7 | CONCAT11(puVar2[lVar8 + 2],puVar2[lVar8 + 3]);
          }
        }
      }
      if (uVar7 != cache_input0[lVar10 + 1]) {
        __assert_fail("get_char<CharT>(from0[i],lcp_input0[i-1]) ==cache_input0[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x433,
                      "void check_input(unsigned char **, lcp_t *, CharT *, size_t) [CharT = unsigned int]"
                     );
      }
      lVar10 = lVar10 + 1;
    } while (n0 - 1 != lVar10);
  }
  return;
}

Assistant:

static void
check_input(unsigned char** from0, lcp_t* lcp_input0, CharT* cache_input0, size_t n0)
{
	(void) from0;
	(void) lcp_input0;
	(void) cache_input0;
	(void) n0;
#ifndef NDEBUG
	for(size_t i=1;i<n0;++i)if(cmp(from0[i-1],from0[i])>0){
		debug()<<"Oops: ''"<<from0[i-1]<<"'' > ''"<<from0[i]<<"''\n";}
	for(size_t i=1;i<n0;++i)if(lcp(from0[i-1],from0[i])!=lcp_input0[i-1]){
		debug()<<"Oops: "<<"lcp('"<<from0[i-1]<<"', '"<<from0[i]<<"')="
			<<lcp(from0[i-1],from0[i])<<" != "<<lcp_input0[i-1]<<"\n";}
	for(size_t i=1;i<n0;++i)assert(cmp(from0[i-1],from0[i])<=0);
	for(size_t i=1;i<n0;++i)assert(lcp(from0[i-1],from0[i])==lcp_input0[i-1]);
	assert(get_char<CharT>(*from0,0)==cache_input0[0]);
	for(size_t i=1;i<n0;++i)assert(get_char<CharT>(from0[i],lcp_input0[i-1])
			==cache_input0[i]);
#endif
}